

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerCPP::emit_push_constant_block(CompilerCPP *this,SPIRVariable *var)

{
  ID *__k;
  SPIRType *type;
  mapped_type *pmVar1;
  CompilerError *this_00;
  char (*ts_3) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string instance_name;
  string buffer_name;
  
  __k = &(var->super_IVariant).self;
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  pmVar1 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
  if (((pmVar1->decoration).decoration_flags.lower & 0x600000000) == 0) {
    emit_block_struct(this,type);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&buffer_name,this,(ulong)(type->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&instance_name,this,(ulong)__k->id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
              (&local_80,this,type,(ulong)__k->id);
    CompilerGLSL::
    statement<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [24])"internal::PushConstant<",&buffer_name,
               &local_80,(char (*) [3])0x3a9154,&instance_name,(char (*) [2])0x3a919d);
    ::std::__cxx11::string::~string((string *)&local_80);
    ts_3 = (char (*) [3])0x39e9d1;
    CompilerGLSL::
    statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[7]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",&instance_name,
               (char (*) [9])" __res->",&instance_name,(char (*) [7])0x39e9d1);
    join<char_const(&)[26],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
              (&local_80,(spirv_cross *)"s.register_push_constant(",(char (*) [26])&instance_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x391533,
               (char (*) [3])0x3a919c,ts_3);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&this->resource_registrations,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x381f19);
    ::std::__cxx11::string::~string((string *)&instance_name);
    ::std::__cxx11::string::~string((string *)&buffer_name);
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_00,
             "Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. Remap to location with reflection API first or disable these decorations."
            );
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerCPP::emit_push_constant_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = ir.meta[var.self].decoration.decoration_flags;
	if (flags.get(DecorationBinding) || flags.get(DecorationDescriptorSet))
		SPIRV_CROSS_THROW("Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. "
		                  "Remap to location with reflection API first or disable these decorations.");

	emit_block_struct(type);
	auto buffer_name = to_name(type.self);
	auto instance_name = to_name(var.self);

	statement("internal::PushConstant<", buffer_name, type_to_array_glsl(type, var.self), "> ", instance_name, ";");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, ".get()");
	resource_registrations.push_back(join("s.register_push_constant(", instance_name, "__", ");"));
	statement("");
}